

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# finders.c
# Opt level: O1

int getMineshafts(int mc,uint64_t seed,int cx0,int cz0,int cx1,int cz1,Pos *out,int nout)

{
  uint uVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  long lVar7;
  long lVar8;
  uint uVar9;
  long lVar10;
  int iVar11;
  uint uVar12;
  uint uVar13;
  int iVar14;
  
  iVar11 = 0;
  if (cx0 <= cx1) {
    lVar2 = (seed ^ 0x5deece66d) * 0x5deece66d + 0xb;
    uVar3 = lVar2 * 0x5deece66d + 0xb;
    lVar8 = (uVar3 & 0xffffffffffff) * 0x5deece66d + 0xb;
    lVar7 = (long)cx0;
    iVar11 = 0;
    do {
      if (cz0 <= cz1) {
        uVar6 = (uint)lVar7;
        uVar1 = -uVar6;
        if (0 < (int)uVar6) {
          uVar1 = uVar6;
        }
        lVar10 = (long)cz0;
        do {
          uVar4 = ((lVar8 * 0x5deece66d0000 + 0xb0000 >> 0x20) +
                  (ulong)((uint)lVar8 & 0xffff0000) * 0x10000) * lVar10 ^
                  ((long)(int)(uVar3 >> 0x10) + (ulong)((uint)lVar2 & 0xffff0000) * 0x10000) * lVar7
                  ^ seed ^ 0x5deece66d;
          uVar9 = (uint)lVar10;
          if (mc < 0x10) {
            uVar4 = uVar4 * 0x7760bb20b4600a69 + 0x40942de6ba;
            uVar5 = uVar4 * 0x5deece66d + 0xb & 0xffffffffffff;
            if ((double)(uVar5 >> 0x15 | (uVar4 & 0xffffffc00000) << 5) * 1.1102230246251565e-16 <
                0.004) {
              uVar13 = uVar1;
              if ((int)uVar1 < (int)uVar9) {
                uVar13 = uVar9;
              }
              uVar12 = -uVar9;
              if (uVar13 != uVar12 && SBORROW4(uVar13,uVar12) == (int)(uVar13 + uVar9) < 0) {
                uVar12 = uVar13;
              }
              if (uVar12 < 0x50) {
                do {
                  uVar5 = uVar5 * 0x5deece66d + 0xb & 0xffffffffffff;
                  iVar14 = (int)(uVar5 >> 0x11);
                  uVar13 = iVar14 + (int)((uVar5 >> 0x11) / 0x50) * -0x50;
                } while (-1 < (int)((uVar13 - iVar14) + -0x50));
                if (uVar12 <= uVar13) goto LAB_0010a6aa;
              }
              if ((out != (Pos *)0x0) && (iVar11 < nout)) {
                out[iVar11].x = uVar6 << 4;
                out[iVar11].z = uVar9 << 4;
              }
              goto LAB_0010a773;
            }
          }
          else {
            uVar4 = uVar4 * 0x5deece66d + 0xb;
            if ((double)((ulong)((uint)(uVar4 * 0x5deece66d + 0xb >> 0x15) & 0x7ffffff) |
                        (uVar4 & 0xffffffc00000) << 5) * 1.1102230246251565e-16 < 0.004) {
              if ((out != (Pos *)0x0) && (iVar11 < nout)) {
                out[iVar11].x = uVar6 << 4;
                out[iVar11].z = uVar9 << 4;
              }
LAB_0010a773:
              iVar11 = iVar11 + 1;
            }
          }
LAB_0010a6aa:
          lVar10 = lVar10 + 1;
        } while (cz1 + 1 != (int)lVar10);
      }
      lVar7 = lVar7 + 1;
    } while (cx1 + 1 != (int)lVar7);
  }
  return iVar11;
}

Assistant:

int getMineshafts(int mc, uint64_t seed, int cx0, int cz0, int cx1, int cz1,
        Pos *out, int nout)
{
    uint64_t s;
    setSeed(&s, seed);
    uint64_t a = nextLong(&s);
    uint64_t b = nextLong(&s);
    int i, j;
    int n = 0;

    for (i = cx0; i <= cx1; i++)
    {
        uint64_t aix = i * a ^ seed;

        for (j = cz0; j <= cz1; j++)
        {
            setSeed(&s, aix ^ j * b);

            if (mc >= MC_1_13)
            {
                if unlikely(nextDouble(&s) < 0.004)
                {
                    if (out && n < nout)
                    {
                        out[n].x = i * 16;
                        out[n].z = j * 16;
                    }
                    n++;
                }
            }
            else
            {
                skipNextN(&s, 1);
                if unlikely(nextDouble(&s) < 0.004)
                {
                    int d = i;
                    if (-i > d) d = -i;
                    if (+j > d) d = +j;
                    if (-j > d) d = -j;
                    if (d >= 80 || nextInt(&s, 80) < d)
                    {
                        if (out && n < nout)
                        {
                            out[n].x = i * 16;
                            out[n].z = j * 16;
                        }
                        n++;
                    }
                }
            }
        }
    }